

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_algorithm_unittest.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SignatureAlgorithmTest_ParseRsaPss_Test::TestBody
          (SignatureAlgorithmTest_ParseRsaPss_Test *this)

{
  pointer puVar1;
  optional<bssl::SignatureAlgorithm> oVar2;
  SignatureAlgorithm *rhs;
  char *message;
  char *in_R9;
  long lVar3;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  initializer_list<unsigned_char> __l_08;
  initializer_list<unsigned_char> __l_09;
  initializer_list<unsigned_char> __l_10;
  initializer_list<unsigned_char> __l_11;
  Input algorithm_identifier;
  Input algorithm_identifier_00;
  allocator_type local_34f;
  allocator_type local_34e;
  allocator_type local_34d;
  allocator_type local_34c;
  allocator_type local_34b;
  allocator_type local_34a;
  allocator_type local_349;
  string local_348 [2];
  undefined8 local_300;
  undefined4 local_2f8;
  undefined2 local_2f4;
  undefined1 local_2f2;
  AssertionResult gtest_ar_;
  long lStack_2b0;
  anon_struct_24_1_898a9ca8 kInvalidTests [7];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined4 local_1e8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined7 uStack_1b0;
  undefined1 local_1a9;
  undefined7 uStack_1a8;
  undefined8 uStack_1a1;
  AssertHelper local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined7 uStack_160;
  undefined1 local_159;
  undefined7 uStack_158;
  undefined8 uStack_151;
  anon_struct_32_2_5384a028 kValidTests [6];
  uchar local_78 [72];
  
  memcpy(kInvalidTests,&DAT_00441fe0,0x43);
  __l._M_len = 0x43;
  __l._M_array = (iterator)kInvalidTests;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kValidTests[0].data,__l,(allocator_type *)&local_1f8);
  kValidTests[0].expected = kRsaPssSha256;
  memcpy(local_348,&DAT_00442023,0x43);
  __l_00._M_len = 0x43;
  __l_00._M_array = (iterator)local_348;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kValidTests[1].data,__l_00,(allocator_type *)&local_300);
  kValidTests[1].expected = kRsaPssSha384;
  memcpy(&gtest_ar_,&DAT_00442066,0x43);
  __l_01._M_len = 0x43;
  __l_01._M_array = &gtest_ar_.success_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kValidTests[2].data,__l_01,&local_34c);
  kValidTests[2].expected = kMaxValue;
  uStack_1a8 = 0x3650148866009;
  uStack_1a1 = 0x20010203a2010204;
  uStack_1b8 = 0x8648862a09061830;
  uStack_1b0 = 0xb300801010df7;
  local_1a9 = 6;
  local_1c8 = 0x48866009060b300d;
  uStack_1c0 = 0x1aa1010204036501;
  local_1d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8648862a09063d30
  ;
  uStack_1d0 = 0xa030300a01010df7;
  __l_02._M_len = 0x3f;
  __l_02._M_array = (iterator)&local_1d8;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kValidTests[3].data,__l_02,&local_34d);
  kValidTests[3].expected = kRsaPssSha256;
  uStack_158 = 0x3650148866009;
  uStack_151 = 0x30010203a2020204;
  uStack_168 = 0x8648862a09061830;
  uStack_160 = 0xb300801010df7;
  local_159 = 6;
  local_178 = 0x48866009060b300d;
  uStack_170 = 0x1aa1020204036501;
  local_188.data_ = (AssertHelperData *)0x8648862a09063d30;
  uStack_180 = 0xa030300a01010df7;
  __l_03._M_len = 0x3f;
  __l_03._M_array = (iterator)&local_188;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kValidTests[4].data,__l_03,&local_34e);
  kValidTests[4].expected = kRsaPssSha384;
  local_78[0x30] = '\t';
  local_78[0x31] = '`';
  local_78[0x32] = 0x86;
  local_78[0x33] = 'H';
  local_78[0x34] = '\x01';
  local_78[0x35] = 'e';
  local_78[0x36] = 3;
  local_78[0x37] = '\x04';
  local_78[0x38] = '\x02';
  local_78[0x39] = '\x03';
  local_78[0x3a] = 0xa2;
  local_78[0x3b] = '\x03';
  local_78[0x3c] = '\x02';
  local_78[0x3d] = '\x01';
  local_78[0x3e] = 0x40;
  local_78[0x20] = '0';
  local_78[0x21] = '\x18';
  local_78[0x22] = '\x06';
  local_78[0x23] = '\t';
  local_78[0x24] = '*';
  local_78[0x25] = 0x86;
  local_78[0x26] = 'H';
  local_78[0x27] = 0x86;
  local_78[0x28] = 0xf7;
  local_78[0x29] = '\r';
  local_78[0x2a] = '\x01';
  local_78[0x2b] = '\x01';
  local_78[0x2c] = '\b';
  local_78[0x2d] = '0';
  local_78[0x2e] = 0xb;
  local_78[0x2f] = 6;
  local_78[0x10] = '\r';
  local_78[0x11] = '0';
  local_78[0x12] = '\v';
  local_78[0x13] = '\x06';
  local_78[0x14] = '\t';
  local_78[0x15] = '`';
  local_78[0x16] = 0x86;
  local_78[0x17] = 'H';
  local_78[0x18] = '\x01';
  local_78[0x19] = 'e';
  local_78[0x1a] = '\x03';
  local_78[0x1b] = '\x04';
  local_78[0x1c] = '\x02';
  local_78[0x1d] = '\x03';
  local_78[0x1e] = 0xa1;
  local_78[0x1f] = '\x1a';
  local_78[0] = '0';
  local_78[1] = '=';
  local_78[2] = '\x06';
  local_78[3] = '\t';
  local_78[4] = '*';
  local_78[5] = 0x86;
  local_78[6] = 'H';
  local_78[7] = 0x86;
  local_78[8] = 0xf7;
  local_78[9] = '\r';
  local_78[10] = '\x01';
  local_78[0xb] = '\x01';
  local_78[0xc] = '\n';
  local_78[0xd] = '0';
  local_78[0xe] = '0';
  local_78[0xf] = 0xa0;
  __l_04._M_len = 0x3f;
  __l_04._M_array = local_78;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kValidTests[5].data,__l_04,&local_34f);
  rhs = &kValidTests[0].expected;
  kValidTests[5].expected = kMaxValue;
  for (lVar3 = 0xc0; lVar3 != 0; lVar3 = lVar3 + -0x20) {
    puVar1 = (((anon_struct_32_2_5384a028 *)(rhs + -6))->data).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    algorithm_identifier.data_.size_ = (long)*(pointer *)(rhs + -4) - (long)puVar1;
    algorithm_identifier.data_.data_ = puVar1;
    local_348[0]._M_dataplus._M_p = (pointer)ParseSignatureAlgorithm(algorithm_identifier);
    testing::internal::CmpHelperEQ<std::optional<bssl::SignatureAlgorithm>,bssl::SignatureAlgorithm>
              ((internal *)kInvalidTests,"ParseSignatureAlgorithm(der::Input(t.data))","t.expected",
               (optional<bssl::SignatureAlgorithm> *)local_348,rhs);
    if ((char)kInvalidTests[0].data.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)local_348);
      message = "";
      if (kInvalidTests[0].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        message = *(char **)kInvalidTests[0].data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/signature_algorithm_unittest.cc"
                 ,0x48f,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)local_348);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
      if ((_Optional_payload_base<bssl::SignatureAlgorithm>)local_348[0]._M_dataplus._M_p !=
          (_Optional_payload_base<bssl::SignatureAlgorithm>)0x0) {
        (**(code **)(*(long *)local_348[0]._M_dataplus._M_p + 8))();
      }
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&kInvalidTests[0].data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    rhs = rhs + 8;
  }
  local_78[0x30] = '\r';
  local_78[0x31] = '\x06';
  local_78[0x32] = '\t';
  local_78[0x33] = '`';
  local_78[0x34] = 0x86;
  local_78[0x35] = 'H';
  local_78[0x36] = 1;
  local_78[0x37] = 'e';
  local_78[0x38] = '\x03';
  local_78[0x39] = '\x04';
  local_78[0x3a] = '\x02';
  local_78[0x3b] = '\x02';
  local_78[0x3c] = '\x05';
  local_78[0x3d] = '\0';
  local_78[0x20] = 0xa1;
  local_78[0x21] = '\x1c';
  local_78[0x22] = '0';
  local_78[0x23] = '\x1a';
  local_78[0x24] = '\x06';
  local_78[0x25] = '\t';
  local_78[0x26] = '*';
  local_78[0x27] = 0x86;
  local_78[0x28] = 'H';
  local_78[0x29] = 0x86;
  local_78[0x2a] = 0xf7;
  local_78[0x2b] = '\r';
  local_78[0x2c] = '\x01';
  local_78[0x2d] = '\x01';
  local_78[0x2e] = 8;
  local_78[0x2f] = 0x30;
  local_78[0x10] = '\x0f';
  local_78[0x11] = '0';
  local_78[0x12] = '\r';
  local_78[0x13] = '\x06';
  local_78[0x14] = '\t';
  local_78[0x15] = '`';
  local_78[0x16] = 0x86;
  local_78[0x17] = 'H';
  local_78[0x18] = '\x01';
  local_78[0x19] = 'e';
  local_78[0x1a] = '\x03';
  local_78[0x1b] = '\x04';
  local_78[0x1c] = '\x02';
  local_78[0x1d] = '\x01';
  local_78[0x1e] = '\x05';
  local_78[0x1f] = '\0';
  local_78[0] = '0';
  local_78[1] = '<';
  local_78[2] = '\x06';
  local_78[3] = '\t';
  local_78[4] = '*';
  local_78[5] = 0x86;
  local_78[6] = 'H';
  local_78[7] = 0x86;
  local_78[8] = 0xf7;
  local_78[9] = '\r';
  local_78[10] = '\x01';
  local_78[0xb] = '\x01';
  local_78[0xc] = '\n';
  local_78[0xd] = '0';
  local_78[0xe] = '/';
  local_78[0xf] = 0xa0;
  __l_05._M_len = 0x3e;
  __l_05._M_array = local_78;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kInvalidTests[0].data,__l_05,&local_34c);
  memcpy(&local_188,&DAT_004421a4,0x41);
  __l_06._M_len = 0x41;
  __l_06._M_array = (iterator)&local_188;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kInvalidTests[1].data,__l_06,&local_34d);
  local_300 = 0x8648862a09060d30;
  local_2f8 = 0x1010df7;
  local_2f4 = 0x300a;
  local_2f2 = 0;
  __l_07._M_len = 0xf;
  __l_07._M_array = (iterator)&local_300;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kInvalidTests[2].data,__l_07,&local_34e);
  local_1f8 = 0x8648862a09061230;
  uStack_1f0 = 0xa205300a01010df7;
  local_1e8 = 0x15010203;
  __l_08._M_len = 0x14;
  __l_08._M_array = (iterator)&local_1f8;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kInvalidTests[3].data,__l_08,&local_34f);
  memcpy(local_348,&DAT_004421f9,0x43);
  __l_09._M_len = 0x43;
  __l_09._M_array = (iterator)local_348;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kInvalidTests[4].data,__l_09,&local_349);
  memcpy(&gtest_ar_,&DAT_0044223c,0x43);
  __l_10._M_len = 0x43;
  __l_10._M_array = &gtest_ar_.success_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kInvalidTests[5].data,__l_10,&local_34a);
  memcpy(&local_1d8,&DAT_0044227f,0x43);
  __l_11._M_len = 0x43;
  __l_11._M_array = (iterator)&local_1d8;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&kInvalidTests[6].data,__l_11,&local_34b);
  for (lVar3 = 8; lVar3 != 0xb0; lVar3 = lVar3 + 0x18) {
    algorithm_identifier_00.data_.size_ =
         *(long *)((long)&kInvalidTests[0].data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar3) -
         (long)*(uchar **)((long)&lStack_2b0 + lVar3);
    algorithm_identifier_00.data_.data_ = *(uchar **)((long)&lStack_2b0 + lVar3);
    oVar2 = ParseSignatureAlgorithm(algorithm_identifier_00);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         ((ulong)oVar2.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
                 super__Optional_payload_base<bssl::SignatureAlgorithm> >> 0x20 & 1) == 0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&local_1d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (local_348,(internal *)&gtest_ar_,
                 (AssertionResult *)"ParseSignatureAlgorithm(der::Input(t.data))","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_188,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/signature_algorithm_unittest.cc"
                 ,0x54d,local_348[0]._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_1d8);
      testing::internal::AssertHelper::~AssertHelper(&local_188);
      ::std::__cxx11::string::~string((string *)local_348);
      if (local_1d8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
      }
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  lVar3 = 0x90;
  do {
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&kInvalidTests[0].data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  lVar3 = 0xa0;
  do {
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&kValidTests[0].data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  return;
}

Assistant:

TEST(SignatureAlgorithmTest, ParseRsaPss) {
  // Test data generated with https://github.com/google/der-ascii.
  struct {
    std::vector<uint8_t> data;
    SignatureAlgorithm expected;
  } kValidTests[] = {
      // SEQUENCE {
      //   # rsassa-pss
      //   OBJECT_IDENTIFIER { 1.2.840.113549.1.1.10 }
      //   SEQUENCE {
      //     [0] {
      //       SEQUENCE {
      //         # sha256
      //         OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.1 }
      //         NULL {}
      //       }
      //     }
      //     [1] {
      //       SEQUENCE {
      //         # mgf1
      //         OBJECT_IDENTIFIER { 1.2.840.113549.1.1.8 }
      //         SEQUENCE {
      //           # sha256
      //           OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.1 }
      //           NULL {}
      //         }
      //       }
      //     }
      //     [2] {
      //       INTEGER { 32 }
      //     }
      //   }
      // }
      {{0x30, 0x41, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01,
        0x0a, 0x30, 0x34, 0xa0, 0x0f, 0x30, 0x0d, 0x06, 0x09, 0x60, 0x86, 0x48,
        0x01, 0x65, 0x03, 0x04, 0x02, 0x01, 0x05, 0x00, 0xa1, 0x1c, 0x30, 0x1a,
        0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01, 0x08, 0x30,
        0x0d, 0x06, 0x09, 0x60, 0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x01,
        0x05, 0x00, 0xa2, 0x03, 0x02, 0x01, 0x20},
       SignatureAlgorithm::kRsaPssSha256},
      // SEQUENCE {
      //   # rsassa-pss
      //   OBJECT_IDENTIFIER { 1.2.840.113549.1.1.10 }
      //   SEQUENCE {
      //     [0] {
      //       SEQUENCE {
      //         # sha384
      //         OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.2 }
      //         NULL {}
      //       }
      //     }
      //     [1] {
      //       SEQUENCE {
      //         # mgf1
      //         OBJECT_IDENTIFIER { 1.2.840.113549.1.1.8 }
      //         SEQUENCE {
      //           # sha384
      //           OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.2 }
      //           NULL {}
      //         }
      //       }
      //     }
      //     [2] {
      //       INTEGER { 48 }
      //     }
      //   }
      // }
      {{0x30, 0x41, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01,
        0x0a, 0x30, 0x34, 0xa0, 0x0f, 0x30, 0x0d, 0x06, 0x09, 0x60, 0x86, 0x48,
        0x01, 0x65, 0x03, 0x04, 0x02, 0x02, 0x05, 0x00, 0xa1, 0x1c, 0x30, 0x1a,
        0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01, 0x08, 0x30,
        0x0d, 0x06, 0x09, 0x60, 0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x02,
        0x05, 0x00, 0xa2, 0x03, 0x02, 0x01, 0x30},
       SignatureAlgorithm::kRsaPssSha384},
      // SEQUENCE {
      //   # rsassa-pss
      //   OBJECT_IDENTIFIER { 1.2.840.113549.1.1.10 }
      //   SEQUENCE {
      //     [0] {
      //       SEQUENCE {
      //         # sha512
      //         OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.3 }
      //         NULL {}
      //       }
      //     }
      //     [1] {
      //       SEQUENCE {
      //         # mgf1
      //         OBJECT_IDENTIFIER { 1.2.840.113549.1.1.8 }
      //         SEQUENCE {
      //           # sha512
      //           OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.3 }
      //           NULL {}
      //         }
      //       }
      //     }
      //     [2] {
      //       INTEGER { 64 }
      //     }
      //   }
      // }
      {{0x30, 0x41, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01,
        0x0a, 0x30, 0x34, 0xa0, 0x0f, 0x30, 0x0d, 0x06, 0x09, 0x60, 0x86, 0x48,
        0x01, 0x65, 0x03, 0x04, 0x02, 0x03, 0x05, 0x00, 0xa1, 0x1c, 0x30, 0x1a,
        0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01, 0x08, 0x30,
        0x0d, 0x06, 0x09, 0x60, 0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x03,
        0x05, 0x00, 0xa2, 0x03, 0x02, 0x01, 0x40},
       SignatureAlgorithm::kRsaPssSha512},

      // The same inputs as above, but the NULLs in the digest algorithms are
      // omitted.
      {{0x30, 0x3d, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01,
        0x01, 0x0a, 0x30, 0x30, 0xa0, 0x0d, 0x30, 0x0b, 0x06, 0x09, 0x60,
        0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x01, 0xa1, 0x1a, 0x30,
        0x18, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01,
        0x08, 0x30, 0x0b, 0x06, 0x09, 0x60, 0x86, 0x48, 0x01, 0x65, 0x03,
        0x04, 0x02, 0x01, 0xa2, 0x03, 0x02, 0x01, 0x20},
       SignatureAlgorithm::kRsaPssSha256},
      {{0x30, 0x3d, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01,
        0x01, 0x0a, 0x30, 0x30, 0xa0, 0x0d, 0x30, 0x0b, 0x06, 0x09, 0x60,
        0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x02, 0xa1, 0x1a, 0x30,
        0x18, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01,
        0x08, 0x30, 0x0b, 0x06, 0x09, 0x60, 0x86, 0x48, 0x01, 0x65, 0x03,
        0x04, 0x02, 0x02, 0xa2, 0x03, 0x02, 0x01, 0x30},
       SignatureAlgorithm::kRsaPssSha384},
      {{0x30, 0x3d, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01,
        0x01, 0x0a, 0x30, 0x30, 0xa0, 0x0d, 0x30, 0x0b, 0x06, 0x09, 0x60,
        0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x03, 0xa1, 0x1a, 0x30,
        0x18, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01,
        0x08, 0x30, 0x0b, 0x06, 0x09, 0x60, 0x86, 0x48, 0x01, 0x65, 0x03,
        0x04, 0x02, 0x03, 0xa2, 0x03, 0x02, 0x01, 0x40},
       SignatureAlgorithm::kRsaPssSha512}};
  for (const auto &t : kValidTests) {
    EXPECT_EQ(ParseSignatureAlgorithm(der::Input(t.data)), t.expected);
  }

  struct {
    std::vector<uint8_t> data;
  } kInvalidTests[] = {
      // SEQUENCE {
      //   # rsassa-pss
      //   OBJECT_IDENTIFIER { 1.2.840.113549.1.1.10 }
      //   SEQUENCE {
      //     [0] {
      //       SEQUENCE {
      //         # sha256
      //         OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.1 }
      //         NULL {}
      //       }
      //     }
      //     [1] {
      //       SEQUENCE {
      //         # mgf1
      //         OBJECT_IDENTIFIER { 1.2.840.113549.1.1.8 }
      //         SEQUENCE {
      //           # sha384
      //           OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.2 }
      //           NULL {}
      //         }
      //       }
      //     }
      //   }
      // }
      {{0x30, 0x3c, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01,
        0x01, 0x0a, 0x30, 0x2f, 0xa0, 0x0f, 0x30, 0x0d, 0x06, 0x09, 0x60,
        0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x01, 0x05, 0x00, 0xa1,
        0x1c, 0x30, 0x1a, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d,
        0x01, 0x01, 0x08, 0x30, 0x0d, 0x06, 0x09, 0x60, 0x86, 0x48, 0x01,
        0x65, 0x03, 0x04, 0x02, 0x02, 0x05, 0x00}},
      // SEQUENCE {
      //   # rsassa-pss
      //   OBJECT_IDENTIFIER { 1.2.840.113549.1.1.10 }
      //   SEQUENCE {
      //     [0] {
      //       SEQUENCE {
      //         # md5
      //         OBJECT_IDENTIFIER { 1.2.840.113549.2.5 }
      //         NULL {}
      //       }
      //     }
      //     [1] {
      //       SEQUENCE {
      //         # mgf1
      //         OBJECT_IDENTIFIER { 1.2.840.113549.1.1.8 }
      //         SEQUENCE {
      //           # md5
      //           OBJECT_IDENTIFIER { 1.2.840.113549.2.5 }
      //           NULL {}
      //         }
      //       }
      //     }
      //     [2] {
      //       INTEGER { 16 }
      //     }
      //   }
      // }
      {{0x30, 0x3f, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01,
        0x01, 0x0a, 0x30, 0x32, 0xa0, 0x0e, 0x30, 0x0c, 0x06, 0x08, 0x2a,
        0x86, 0x48, 0x86, 0xf7, 0x0d, 0x02, 0x05, 0x05, 0x00, 0xa1, 0x1b,
        0x30, 0x19, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01,
        0x01, 0x08, 0x30, 0x0c, 0x06, 0x08, 0x2a, 0x86, 0x48, 0x86, 0xf7,
        0x0d, 0x02, 0x05, 0x05, 0x00, 0xa2, 0x03, 0x02, 0x01, 0x10}},
      // SEQUENCE {
      //   # rsassa-pss
      //   OBJECT_IDENTIFIER { 1.2.840.113549.1.1.10 }
      //   # SHA-1 with salt length 20 is the default.
      //   SEQUENCE {}
      // }
      {{0x30, 0x0d, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01,
        0x0a, 0x30, 0x00}},
      // SEQUENCE {
      //   # rsassa-pss
      //   OBJECT_IDENTIFIER { 1.2.840.113549.1.1.10 }
      //   SEQUENCE {
      //     [2] {
      //       INTEGER { 21 }
      //     }
      //   }
      // }
      {{0x30, 0x12, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d,
        0x01, 0x01, 0x0a, 0x30, 0x05, 0xa2, 0x03, 0x02, 0x01, 0x15}},
      // SEQUENCE {
      //   # rsassa-pss
      //   OBJECT_IDENTIFIER { 1.2.840.113549.1.1.10 }
      //   SEQUENCE {
      //     [0] {
      //       SEQUENCE {
      //         # sha256
      //         OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.1 }
      //         NULL {}
      //       }
      //     }
      //     [1] {
      //       SEQUENCE {
      //         # mgf1
      //         OBJECT_IDENTIFIER { 1.2.840.113549.1.1.8 }
      //         SEQUENCE {
      //           # sha256
      //           OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.1 }
      //           NULL {}
      //         }
      //       }
      //     }
      //     [2] {
      //       INTEGER { 33 }
      //     }
      //   }
      // }
      {{0x30, 0x41, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01,
        0x0a, 0x30, 0x34, 0xa0, 0x0f, 0x30, 0x0d, 0x06, 0x09, 0x60, 0x86, 0x48,
        0x01, 0x65, 0x03, 0x04, 0x02, 0x01, 0x05, 0x00, 0xa1, 0x1c, 0x30, 0x1a,
        0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01, 0x08, 0x30,
        0x0d, 0x06, 0x09, 0x60, 0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x01,
        0x05, 0x00, 0xa2, 0x03, 0x02, 0x01, 0x21}},
      // SEQUENCE {
      //   # rsassa-pss
      //   OBJECT_IDENTIFIER { 1.2.840.113549.1.1.10 }
      //   SEQUENCE {
      //     [0] {
      //       SEQUENCE {
      //         # sha384
      //         OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.2 }
      //         NULL {}
      //       }
      //     }
      //     [1] {
      //       SEQUENCE {
      //         # mgf1
      //         OBJECT_IDENTIFIER { 1.2.840.113549.1.1.8 }
      //         SEQUENCE {
      //           # sha384
      //           OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.2 }
      //           NULL {}
      //         }
      //       }
      //     }
      //     [2] {
      //       INTEGER { 49 }
      //     }
      //   }
      // }
      {{0x30, 0x41, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01,
        0x0a, 0x30, 0x34, 0xa0, 0x0f, 0x30, 0x0d, 0x06, 0x09, 0x60, 0x86, 0x48,
        0x01, 0x65, 0x03, 0x04, 0x02, 0x02, 0x05, 0x00, 0xa1, 0x1c, 0x30, 0x1a,
        0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01, 0x08, 0x30,
        0x0d, 0x06, 0x09, 0x60, 0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x02,
        0x05, 0x00, 0xa2, 0x03, 0x02, 0x01, 0x31}},

      // SEQUENCE {
      //   # rsassa-pss
      //   OBJECT_IDENTIFIER { 1.2.840.113549.1.1.10 }
      //   SEQUENCE {
      //     [0] {
      //       SEQUENCE {
      //         # sha512
      //         OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.3 }
      //         NULL {}
      //       }
      //     }
      //     [1] {
      //       SEQUENCE {
      //         # mgf1
      //         OBJECT_IDENTIFIER { 1.2.840.113549.1.1.8 }
      //         SEQUENCE {
      //           # sha512
      //           OBJECT_IDENTIFIER { 2.16.840.1.101.3.4.2.3 }
      //           NULL {}
      //         }
      //       }
      //     }
      //     [2] {
      //       INTEGER { 65 }
      //     }
      //   }
      // }
      {{0x30, 0x41, 0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01,
        0x0a, 0x30, 0x34, 0xa0, 0x0f, 0x30, 0x0d, 0x06, 0x09, 0x60, 0x86, 0x48,
        0x01, 0x65, 0x03, 0x04, 0x02, 0x03, 0x05, 0x00, 0xa1, 0x1c, 0x30, 0x1a,
        0x06, 0x09, 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01, 0x08, 0x30,
        0x0d, 0x06, 0x09, 0x60, 0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x03,
        0x05, 0x00, 0xa2, 0x03, 0x02, 0x01, 0x41}},
  };
  for (const auto &t : kInvalidTests) {
    EXPECT_FALSE(ParseSignatureAlgorithm(der::Input(t.data)));
  }
}